

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bandpre.c
# Opt level: O2

int cvBandPrecSolve(sunrealtype t,N_Vector y,N_Vector fy,N_Vector r,N_Vector z,sunrealtype gamma,
                   sunrealtype delta,int lr,void *bp_data)

{
  int iVar1;
  
  iVar1 = SUNLinSolSolve(0,*(undefined8 *)((long)bp_data + 0x28),
                         *(undefined8 *)((long)bp_data + 0x20),z,r);
  return iVar1;
}

Assistant:

static int cvBandPrecSolve(SUNDIALS_MAYBE_UNUSED sunrealtype t,
                           SUNDIALS_MAYBE_UNUSED N_Vector y,
                           SUNDIALS_MAYBE_UNUSED N_Vector fy, N_Vector r,
                           N_Vector z, SUNDIALS_MAYBE_UNUSED sunrealtype gamma,
                           SUNDIALS_MAYBE_UNUSED sunrealtype delta,
                           SUNDIALS_MAYBE_UNUSED int lr, void* bp_data)
{
  CVBandPrecData pdata;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata = (CVBandPrecData)bp_data;

  /* Call banded solver object to do the work */
  retval = SUNLinSolSolve(pdata->LS, pdata->savedP, z, r, ZERO);
  return (retval);
}